

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_graphicsmagick_external
          (CImg<unsigned_char> *this,char *filename)

{
  char *pcVar1;
  FILE *pFVar2;
  char *pcVar3;
  CImgArgumentException *this_00;
  CImgIOException *this_01;
  char filetmp [512];
  char command [1024];
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    pcVar1 = "non-";
    if (this->_is_shared != false) {
      pcVar1 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_graphicsmagick_external() : Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar1,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
  }
  memset(command,0,0x400);
  memset(filetmp,0,0x200);
  pcVar1 = cimg::graphicsmagick_path((char *)0x0,false);
  snprintf(command,0x400,"%s convert \"%s\" pnm:-",pcVar1,filename);
  pFVar2 = popen(command,"r");
  if (pFVar2 == (FILE *)0x0) {
    while( true ) {
      pcVar1 = cimg::temporary_path((char *)0x0,false);
      pcVar3 = cimg::filenamerand();
      snprintf(filetmp,0x200,"%s%c%s.pnm",pcVar1,0x2f,pcVar3);
      pFVar2 = fopen(filetmp,"rb");
      if (pFVar2 == (FILE *)0x0) break;
      cimg::fclose(pFVar2);
    }
    pcVar1 = cimg::graphicsmagick_path((char *)0x0,false);
    snprintf(command,0x400,"%s convert \"%s\" \"%s\"",pcVar1,filename,filetmp);
    cimg::graphicsmagick_path((char *)0x0,false);
    system(command);
    pFVar2 = fopen(filetmp,"rb");
    if (pFVar2 == (FILE *)0x0) {
      pFVar2 = cimg::fopen(filename,"r");
      cimg::fclose(pFVar2);
      this_01 = (CImgIOException *)__cxa_allocate_exception(0x4008);
      pcVar1 = "non-";
      if (this->_is_shared != false) {
        pcVar1 = "";
      }
      CImgIOException::CImgIOException
                (this_01,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_graphicsmagick_external() : Failed to load file \'%s\' with external command \'gm\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar1,"unsigned char",filename);
      __cxa_throw(this_01,&CImgIOException::typeinfo,std::exception::~exception);
    }
    cimg::fclose(pFVar2);
    load_pnm(this,filetmp);
    remove(filetmp);
  }
  else {
    load_pnm(this,(FILE *)pFVar2);
    pclose(pFVar2);
  }
  return this;
}

Assistant:

CImg<T>& load_graphicsmagick_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_graphicsmagick_external() : Specified filename is (null).",
                                    cimg_instance);

      char command[1024] = { 0 }, filetmp[512] = { 0 };
      std::FILE *file = 0;
#if cimg_OS==1
      cimg_snprintf(command,sizeof(command),"%s convert \"%s\" pnm:-",cimg::graphicsmagick_path(),filename);
      file = popen(command,"r");
      if (file) {
        try { load_pnm(file); } catch (...) {
          pclose(file);
          throw CImgIOException(_cimg_instance
                                "load_graphicsmagick_external() : Failed to load file '%s' with external command 'gm'.",
                                cimg_instance,
                                filename);
        }
        pclose(file);
        return *this;
      }
#endif
      do {
        cimg_snprintf(filetmp,sizeof(filetmp),"%s%c%s.pnm",cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        if ((file=std::fopen(filetmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,sizeof(command),"%s convert \"%s\" \"%s\"",cimg::graphicsmagick_path(),filename,filetmp);
      cimg::system(command,cimg::graphicsmagick_path());
      if (!(file = std::fopen(filetmp,"rb"))) {
        cimg::fclose(cimg::fopen(filename,"r"));
        throw CImgIOException(_cimg_instance
                              "load_graphicsmagick_external() : Failed to load file '%s' with external command 'gm'.",
                              cimg_instance,
                              filename);

      } else cimg::fclose(file);
      load_pnm(filetmp);
      std::remove(filetmp);
      return *this;
    }